

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O0

void __thiscall
t_netstd_generator::generate_process_function_async
          (t_netstd_generator *this,ostream *out,t_service *tservice,t_function *tfunction)

{
  vector<t_field_*,_std::allocator<t_field_*>_> *scope;
  t_service *ptVar1;
  bool bVar2;
  uint uVar3;
  ostream *poVar4;
  string *psVar5;
  size_type sVar6;
  t_struct *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  t_type *ptVar7;
  members_type *members;
  reference pptVar8;
  char *__rhs;
  string local_8a0;
  string local_880;
  string local_860;
  string local_840;
  string local_820;
  string local_800;
  string local_7e0;
  allocator local_7b9;
  string local_7b8;
  string local_798;
  string local_778;
  string local_758;
  string local_738;
  string local_718;
  string local_6f8;
  string local_6d8;
  allocator local_6b1;
  string local_6b0;
  undefined1 local_690 [8];
  string tmpvar;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  allocator local_589;
  string local_588;
  undefined1 local_568 [8];
  string tmpex;
  string local_528;
  string local_508;
  string local_4e8;
  string local_4c8;
  string local_4a8;
  string local_488;
  string local_468;
  allocator local_441;
  string local_440;
  undefined1 local_420 [8];
  string tmpex_1;
  string local_3f0;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_3d0
  ;
  const_iterator x_iter;
  string local_3a8;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_388
  ;
  t_field **local_380;
  byte local_371;
  undefined1 local_370 [7];
  bool first;
  string local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  allocator local_2a9;
  key_type local_2a8;
  _Self local_288;
  _Self local_280;
  byte local_271;
  const_iterator cStack_270;
  bool is_deprecated;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  t_struct *arg_struct;
  string local_238;
  members_type *local_218;
  vector<t_field_*,_std::allocator<t_field_*>_> *xceptions;
  t_struct *xs;
  string local_1e8;
  string local_1c8;
  allocator local_1a1;
  string local_1a0;
  undefined1 local_180 [8];
  string tmpResult;
  string local_140;
  string local_120;
  allocator local_f9;
  string local_f8;
  undefined1 local_d8 [8];
  string args;
  string resultname;
  string argsname;
  string local_48;
  t_function *local_28;
  t_function *tfunction_local;
  t_service *tservice_local;
  ostream *out_local;
  t_netstd_generator *this_local;
  
  local_28 = tfunction;
  tfunction_local = (t_function *)tservice;
  tservice_local = (t_service *)out;
  out_local = (ostream *)this;
  t_generator::indent_abi_cxx11_(&local_48,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_48);
  poVar4 = std::operator<<(poVar4,"public async global::System.Threading.Tasks.Task ");
  psVar5 = t_function::get_name_abi_cxx11_(local_28);
  poVar4 = std::operator<<(poVar4,(string *)psVar5);
  poVar4 = std::operator<<(poVar4,
                           "_ProcessAsync(int seqid, TProtocol iprot, TProtocol oprot, CancellationToken "
                          );
  poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,")");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_((string *)((long)&argsname.field_2 + 8),(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)(argsname.field_2._M_local_buf + 8));
  poVar4 = std::operator<<(poVar4,"{");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)(argsname.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_48);
  t_generator::indent_up((t_generator *)this);
  psVar5 = t_function::get_name_abi_cxx11_(local_28);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&resultname.field_2 + 8),psVar5,"_args");
  psVar5 = t_function::get_name_abi_cxx11_(local_28);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&args.field_2 + 8),psVar5,"_result");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"tmp",&local_f9);
  t_generator::tmp((string *)local_d8,(t_generator *)this,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  ptVar1 = tservice_local;
  t_generator::indent_abi_cxx11_(&local_120,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_120);
  poVar4 = std::operator<<(poVar4,"var ");
  poVar4 = std::operator<<(poVar4,(string *)local_d8);
  poVar4 = std::operator<<(poVar4," = new InternalStructs.");
  poVar4 = std::operator<<(poVar4,(string *)(resultname.field_2._M_local_buf + 8));
  poVar4 = std::operator<<(poVar4,"();");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_140,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_140);
  poVar4 = std::operator<<(poVar4,"await ");
  poVar4 = std::operator<<(poVar4,(string *)local_d8);
  poVar4 = std::operator<<(poVar4,".ReadAsync(iprot, ");
  poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,");");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_((string *)((long)&tmpResult.field_2 + 8),(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)(tmpResult.field_2._M_local_buf + 8));
  poVar4 = std::operator<<(poVar4,"await iprot.ReadMessageEndAsync(");
  poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,");");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)(tmpResult.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a0,"tmp",&local_1a1);
  t_generator::tmp((string *)local_180,(t_generator *)this,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  bVar2 = t_function::is_oneway(local_28);
  ptVar1 = tservice_local;
  if (!bVar2) {
    t_generator::indent_abi_cxx11_(&local_1c8,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_1c8);
    poVar4 = std::operator<<(poVar4,"var ");
    poVar4 = std::operator<<(poVar4,(string *)local_180);
    poVar4 = std::operator<<(poVar4," = new InternalStructs.");
    poVar4 = std::operator<<(poVar4,(string *)(args.field_2._M_local_buf + 8));
    poVar4 = std::operator<<(poVar4,"();");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1c8);
  }
  ptVar1 = tservice_local;
  t_generator::indent_abi_cxx11_(&local_1e8,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_1e8);
  poVar4 = std::operator<<(poVar4,"try");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_((string *)&xs,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&xs);
  poVar4 = std::operator<<(poVar4,"{");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&xs);
  std::__cxx11::string::~string((string *)&local_1e8);
  t_generator::indent_up((t_generator *)this);
  xceptions = (vector<t_field_*,_std::allocator<t_field_*>_> *)t_function::get_xceptions(local_28);
  local_218 = t_struct::get_members((t_struct *)xceptions);
  sVar6 = std::vector<t_field_*,_std::allocator<t_field_*>_>::size(local_218);
  ptVar1 = tservice_local;
  if (sVar6 != 0) {
    t_generator::indent_abi_cxx11_(&local_238,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_238);
    poVar4 = std::operator<<(poVar4,"try");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_((string *)&arg_struct,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&arg_struct);
    poVar4 = std::operator<<(poVar4,"{");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&arg_struct);
    std::__cxx11::string::~string((string *)&local_238);
    t_generator::indent_up((t_generator *)this);
  }
  this_00 = t_function::get_arglist(local_28);
  f_iter._M_current = (t_field **)t_struct::get_members(this_00);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&stack0xfffffffffffffd90);
  local_280._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&local_28->annotations_);
  this_01 = &local_28->annotations_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a8,"deprecated",&local_2a9);
  local_288._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(this_01,&local_2a8);
  bVar2 = std::operator!=(&local_280,&local_288);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  ptVar1 = tservice_local;
  local_271 = bVar2;
  if (bVar2) {
    t_generator::indent_abi_cxx11_(&local_2d0,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_2d0);
    poVar4 = std::operator<<(poVar4,"#pragma warning disable CS0618,CS0612");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_2d0);
  }
  ptVar1 = tservice_local;
  t_generator::indent_abi_cxx11_(&local_2f0,(t_generator *)this);
  std::operator<<((ostream *)ptVar1,(string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_2f0);
  bVar2 = t_function::is_oneway(local_28);
  if (!bVar2) {
    ptVar7 = t_function::get_returntype(local_28);
    uVar3 = (*(ptVar7->super_t_doc)._vptr_t_doc[4])();
    if ((uVar3 & 1) == 0) {
      poVar4 = std::operator<<((ostream *)tservice_local,(string *)local_180);
      std::operator<<(poVar4,".Success = ");
    }
  }
  poVar4 = std::operator<<((ostream *)tservice_local,"await _iAsync.");
  psVar5 = t_function::get_name_abi_cxx11_(local_28);
  std::__cxx11::string::string((string *)local_370,(string *)psVar5);
  normalize_name(&local_350,this,(string *)local_370,false);
  __rhs = "";
  if ((this->add_async_postfix & 1U) != 0) {
    __rhs = "Async";
  }
  std::operator+(&local_330,&local_350,__rhs);
  func_name(&local_310,this,&local_330,false);
  poVar4 = std::operator<<(poVar4,(string *)&local_310);
  std::operator<<(poVar4,"(");
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)local_370);
  local_371 = 1;
  collect_extensions_types(this,this_00);
  prepare_member_name_mapping(this,this_00);
  local_380 = (t_field **)
              std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  cStack_270 = (const_iterator)local_380;
  while( true ) {
    local_388._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
    bVar2 = __gnu_cxx::operator!=(&stack0xfffffffffffffd90,&local_388);
    if (!bVar2) break;
    if ((local_371 & 1) == 0) {
      std::operator<<((ostream *)tservice_local,", ");
    }
    else {
      local_371 = 0;
    }
    poVar4 = std::operator<<((ostream *)tservice_local,(string *)local_d8);
    poVar4 = std::operator<<(poVar4,".");
    pptVar8 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&stack0xfffffffffffffd90);
    prop_name_abi_cxx11_(&local_3a8,this,*pptVar8,false);
    std::operator<<(poVar4,(string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_3a8);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&stack0xfffffffffffffd90);
  }
  cleanup_member_name_mapping(this,this_00);
  if ((local_371 & 1) == 0) {
    std::operator<<((ostream *)tservice_local,", ");
  }
  poVar4 = std::operator<<((ostream *)tservice_local,"");
  poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,");");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  ptVar1 = tservice_local;
  if ((local_271 & 1) != 0) {
    t_generator::indent_abi_cxx11_((string *)&x_iter,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)ptVar1,(string *)&x_iter);
    poVar4 = std::operator<<(poVar4,"#pragma warning restore CS0618,CS0612");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&x_iter);
  }
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_3d0);
  collect_extensions_types(this,(t_struct *)xceptions);
  scope = xceptions;
  members = t_struct::get_members((t_struct *)xceptions);
  prepare_member_name_mapping(this,(t_struct *)scope,members,(string *)((long)&args.field_2 + 8));
  sVar6 = std::vector<t_field_*,_std::allocator<t_field_*>_>::size(local_218);
  if (sVar6 != 0) {
    t_generator::indent_down((t_generator *)this);
    ptVar1 = tservice_local;
    t_generator::indent_abi_cxx11_(&local_3f0,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_3f0);
    poVar4 = std::operator<<(poVar4,"}");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_3f0);
    local_3d0._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(local_218);
    while( true ) {
      tmpex_1.field_2._8_8_ = std::vector<t_field_*,_std::allocator<t_field_*>_>::end(local_218);
      bVar2 = __gnu_cxx::operator!=
                        (&local_3d0,
                         (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)((long)&tmpex_1.field_2 + 8));
      if (!bVar2) break;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_440,"tmp",&local_441);
      t_generator::tmp((string *)local_420,(t_generator *)this,&local_440);
      std::__cxx11::string::~string((string *)&local_440);
      std::allocator<char>::~allocator((allocator<char> *)&local_441);
      ptVar1 = tservice_local;
      t_generator::indent_abi_cxx11_(&local_468,(t_generator *)this);
      poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_468);
      poVar4 = std::operator<<(poVar4,"catch (");
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_3d0);
      ptVar7 = t_field::get_type(*pptVar8);
      type_name_abi_cxx11_(&local_488,this,ptVar7,true);
      poVar4 = std::operator<<(poVar4,(string *)&local_488);
      poVar4 = std::operator<<(poVar4," ");
      poVar4 = std::operator<<(poVar4,(string *)local_420);
      poVar4 = std::operator<<(poVar4,")");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_4a8,(t_generator *)this);
      poVar4 = std::operator<<(poVar4,(string *)&local_4a8);
      poVar4 = std::operator<<(poVar4,"{");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_4a8);
      std::__cxx11::string::~string((string *)&local_488);
      std::__cxx11::string::~string((string *)&local_468);
      bVar2 = t_function::is_oneway(local_28);
      if (!bVar2) {
        t_generator::indent_up((t_generator *)this);
        ptVar1 = tservice_local;
        t_generator::indent_abi_cxx11_(&local_4c8,(t_generator *)this);
        poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_4c8);
        poVar4 = std::operator<<(poVar4,(string *)local_180);
        poVar4 = std::operator<<(poVar4,".");
        pptVar8 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_3d0);
        prop_name_abi_cxx11_(&local_4e8,this,*pptVar8,false);
        poVar4 = std::operator<<(poVar4,(string *)&local_4e8);
        poVar4 = std::operator<<(poVar4," = ");
        poVar4 = std::operator<<(poVar4,(string *)local_420);
        poVar4 = std::operator<<(poVar4,";");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_4e8);
        std::__cxx11::string::~string((string *)&local_4c8);
        t_generator::indent_down((t_generator *)this);
      }
      ptVar1 = tservice_local;
      t_generator::indent_abi_cxx11_(&local_508,(t_generator *)this);
      poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_508);
      poVar4 = std::operator<<(poVar4,"}");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_508);
      std::__cxx11::string::~string((string *)local_420);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++(&local_3d0);
    }
  }
  bVar2 = t_function::is_oneway(local_28);
  ptVar1 = tservice_local;
  if (!bVar2) {
    t_generator::indent_abi_cxx11_(&local_528,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_528);
    poVar4 = std::operator<<(poVar4,"await oprot.WriteMessageBeginAsync(new TMessage(\"");
    psVar5 = t_function::get_name_abi_cxx11_(local_28);
    poVar4 = std::operator<<(poVar4,(string *)psVar5);
    poVar4 = std::operator<<(poVar4,"\", TMessageType.Reply, seqid), ");
    poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,"); ");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_((string *)((long)&tmpex.field_2 + 8),(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)(tmpex.field_2._M_local_buf + 8));
    poVar4 = std::operator<<(poVar4,"await ");
    poVar4 = std::operator<<(poVar4,(string *)local_180);
    poVar4 = std::operator<<(poVar4,".WriteAsync(oprot, ");
    poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,");");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)(tmpex.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_528);
  }
  t_generator::indent_down((t_generator *)this);
  cleanup_member_name_mapping(this,xceptions);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_588,"tmp",&local_589);
  t_generator::tmp((string *)local_568,(t_generator *)this,&local_588);
  std::__cxx11::string::~string((string *)&local_588);
  std::allocator<char>::~allocator((allocator<char> *)&local_589);
  ptVar1 = tservice_local;
  t_generator::indent_abi_cxx11_(&local_5b0,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_5b0);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_5d0,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_5d0);
  poVar4 = std::operator<<(poVar4,"catch (TTransportException)");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_5f0,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_5f0);
  poVar4 = std::operator<<(poVar4,"{");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_610,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_610);
  poVar4 = std::operator<<(poVar4,"  throw;");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_630,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_630);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_650,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_650);
  poVar4 = std::operator<<(poVar4,"catch (Exception ");
  poVar4 = std::operator<<(poVar4,(string *)local_568);
  poVar4 = std::operator<<(poVar4,")");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_((string *)((long)&tmpvar.field_2 + 8),(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)(tmpvar.field_2._M_local_buf + 8));
  poVar4 = std::operator<<(poVar4,"{");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)(tmpvar.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_650);
  std::__cxx11::string::~string((string *)&local_630);
  std::__cxx11::string::~string((string *)&local_610);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::__cxx11::string::~string((string *)&local_5b0);
  t_generator::indent_up((t_generator *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6b0,"tmp",&local_6b1);
  t_generator::tmp((string *)local_690,(t_generator *)this,&local_6b0);
  std::__cxx11::string::~string((string *)&local_6b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6b1);
  ptVar1 = tservice_local;
  t_generator::indent_abi_cxx11_(&local_6d8,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_6d8);
  poVar4 = std::operator<<(poVar4,"var ");
  poVar4 = std::operator<<(poVar4,(string *)local_690);
  poVar4 = std::operator<<(poVar4," = $\"Error occurred in {GetType().FullName}: {");
  poVar4 = std::operator<<(poVar4,(string *)local_568);
  poVar4 = std::operator<<(poVar4,".Message}\";");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_6d8);
  ptVar1 = tservice_local;
  t_generator::indent_abi_cxx11_(&local_6f8,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_6f8);
  poVar4 = std::operator<<(poVar4,"if(_logger != null)");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_6f8);
  t_generator::indent_up((t_generator *)this);
  ptVar1 = tservice_local;
  t_generator::indent_abi_cxx11_(&local_718,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_718);
  poVar4 = std::operator<<(poVar4,"_logger.LogError(");
  poVar4 = std::operator<<(poVar4,(string *)local_568);
  poVar4 = std::operator<<(poVar4,", ");
  poVar4 = std::operator<<(poVar4,(string *)local_690);
  poVar4 = std::operator<<(poVar4,");");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_718);
  t_generator::indent_down((t_generator *)this);
  ptVar1 = tservice_local;
  t_generator::indent_abi_cxx11_(&local_738,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_738);
  poVar4 = std::operator<<(poVar4,"else");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_738);
  t_generator::indent_up((t_generator *)this);
  ptVar1 = tservice_local;
  t_generator::indent_abi_cxx11_(&local_758,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_758);
  poVar4 = std::operator<<(poVar4,"Console.Error.WriteLine(");
  poVar4 = std::operator<<(poVar4,(string *)local_690);
  poVar4 = std::operator<<(poVar4,");");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_758);
  t_generator::indent_down((t_generator *)this);
  bVar2 = t_function::is_oneway(local_28);
  if (bVar2) {
    t_generator::indent_down((t_generator *)this);
    ptVar1 = tservice_local;
    t_generator::indent_abi_cxx11_(&local_778,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_778);
    poVar4 = std::operator<<(poVar4,"}");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_778);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_7b8,"tmp",&local_7b9);
    t_generator::tmp(&local_798,(t_generator *)this,&local_7b8);
    std::__cxx11::string::operator=((string *)local_690,(string *)&local_798);
    std::__cxx11::string::~string((string *)&local_798);
    std::__cxx11::string::~string((string *)&local_7b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_7b9);
    ptVar1 = tservice_local;
    t_generator::indent_abi_cxx11_(&local_7e0,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_7e0);
    poVar4 = std::operator<<(poVar4,"var ");
    poVar4 = std::operator<<(poVar4,(string *)local_690);
    poVar4 = std::operator<<(poVar4,
                             " = new TApplicationException(TApplicationException.ExceptionType.InternalError,\" Internal error.\");"
                            );
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_800,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_800);
    poVar4 = std::operator<<(poVar4,"await oprot.WriteMessageBeginAsync(new TMessage(\"");
    psVar5 = t_function::get_name_abi_cxx11_(local_28);
    poVar4 = std::operator<<(poVar4,(string *)psVar5);
    poVar4 = std::operator<<(poVar4,"\", TMessageType.Exception, seqid), ");
    poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,");");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_820,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_820);
    poVar4 = std::operator<<(poVar4,"await ");
    poVar4 = std::operator<<(poVar4,(string *)local_690);
    poVar4 = std::operator<<(poVar4,".WriteAsync(oprot, ");
    poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,");");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_820);
    std::__cxx11::string::~string((string *)&local_800);
    std::__cxx11::string::~string((string *)&local_7e0);
    t_generator::indent_down((t_generator *)this);
    ptVar1 = tservice_local;
    t_generator::indent_abi_cxx11_(&local_840,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_840);
    poVar4 = std::operator<<(poVar4,"}");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_860,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_860);
    poVar4 = std::operator<<(poVar4,"await oprot.WriteMessageEndAsync(");
    poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,");");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_880,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_880);
    poVar4 = std::operator<<(poVar4,"await oprot.Transport.FlushAsync(");
    poVar4 = std::operator<<(poVar4,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,");");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_880);
    std::__cxx11::string::~string((string *)&local_860);
    std::__cxx11::string::~string((string *)&local_840);
  }
  t_generator::indent_down((t_generator *)this);
  ptVar1 = tservice_local;
  t_generator::indent_abi_cxx11_(&local_8a0,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)ptVar1,(string *)&local_8a0);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_8a0);
  std::__cxx11::string::~string((string *)local_690);
  std::__cxx11::string::~string((string *)local_568);
  std::__cxx11::string::~string((string *)local_180);
  std::__cxx11::string::~string((string *)local_d8);
  std::__cxx11::string::~string((string *)(args.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(resultname.field_2._M_local_buf + 8));
  return;
}

Assistant:

void t_netstd_generator::generate_process_function_async(ostream& out, t_service* tservice, t_function* tfunction)
{
    (void)tservice;
    out << indent() << "public async global::System.Threading.Tasks.Task " << tfunction->get_name()
        << "_ProcessAsync(int seqid, TProtocol iprot, TProtocol oprot, CancellationToken " << CANCELLATION_TOKEN_NAME << ")" << endl
        << indent() << "{" << endl;
    indent_up();

    string argsname = tfunction->get_name() + "_args";
    string resultname = tfunction->get_name() + "_result";

    string args = tmp("tmp");
    out << indent() << "var " << args << " = new InternalStructs." << argsname << "();" << endl
        << indent() << "await " << args << ".ReadAsync(iprot, " << CANCELLATION_TOKEN_NAME << ");" << endl
        << indent() << "await iprot.ReadMessageEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;

    string tmpResult = tmp("tmp");
    if (!tfunction->is_oneway())
    {
        out << indent() << "var " << tmpResult << " = new InternalStructs." << resultname << "();" << endl;
    }

    out << indent() << "try" << endl
        << indent() << "{" << endl;
    indent_up();

    t_struct* xs = tfunction->get_xceptions();
    const vector<t_field*>& xceptions = xs->get_members();

    if (xceptions.size() > 0)
    {
        out << indent() << "try" << endl
            << indent() << "{" << endl;
        indent_up();
    }

    t_struct* arg_struct = tfunction->get_arglist();
    const vector<t_field*>& fields = arg_struct->get_members();
    vector<t_field*>::const_iterator f_iter;

    bool is_deprecated = (tfunction->annotations_.end() != tfunction->annotations_.find("deprecated"));
    if( is_deprecated) {
      out << indent() << "#pragma warning disable CS0618,CS0612" << endl;
    }

    out << indent();
    if (!tfunction->is_oneway() && !tfunction->get_returntype()->is_void())
    {
        out << tmpResult << ".Success = ";
    }

    out << "await _iAsync." << func_name(normalize_name(tfunction->get_name()) + (add_async_postfix ? "Async" : "")) << "(";

    bool first = true;
    collect_extensions_types(arg_struct);
    prepare_member_name_mapping(arg_struct);
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter)
    {
        if (first)
        {
            first = false;
        }
        else
        {
            out << ", ";
        }

        out << args << "." << prop_name(*f_iter);
    }

    cleanup_member_name_mapping(arg_struct);

    if (!first)
    {
        out << ", ";
    }

    out << "" << CANCELLATION_TOKEN_NAME << ");" << endl;

    if( is_deprecated) {
      out << indent() << "#pragma warning restore CS0618,CS0612" << endl;
    }

    vector<t_field*>::const_iterator x_iter;

    collect_extensions_types(xs);
    prepare_member_name_mapping(xs, xs->get_members(), resultname);
    if (xceptions.size() > 0)
    {
        indent_down();
        out << indent() << "}" << endl;

        for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter)
        {
            string tmpex = tmp("tmp");
            out << indent() << "catch (" << type_name((*x_iter)->get_type()) << " " << tmpex << ")" << endl
                << indent() << "{" << endl;

            if (!tfunction->is_oneway())
            {
                indent_up();
                out << indent() << tmpResult << "." << prop_name(*x_iter) << " = " << tmpex << ";" << endl;
                indent_down();
            }
            out << indent() << "}" << endl;
        }
    }

    if (!tfunction->is_oneway())
    {
        out << indent() << "await oprot.WriteMessageBeginAsync(new TMessage(\""
                << tfunction->get_name() << "\", TMessageType.Reply, seqid), " << CANCELLATION_TOKEN_NAME << "); " << endl
            << indent() << "await " << tmpResult << ".WriteAsync(oprot, " << CANCELLATION_TOKEN_NAME << ");" << endl;
    }
    indent_down();

    cleanup_member_name_mapping(xs);

    string tmpex = tmp("tmp");
    out << indent() << "}" << endl
        << indent() << "catch (TTransportException)" << endl
        << indent() << "{" << endl
        << indent() << "  throw;" << endl
        << indent() << "}" << endl
        << indent() << "catch (Exception " << tmpex << ")" << endl
        << indent() << "{" << endl;
    indent_up();

    string tmpvar = tmp("tmp");
    out << indent() << "var " << tmpvar << " = $\"Error occurred in {GetType().FullName}: {" << tmpex << ".Message}\";" << endl;
    out << indent() << "if(_logger != null)" << endl;
    indent_up();
    out << indent() << "_logger.LogError(" << tmpex << ", " << tmpvar << ");" << endl;
    indent_down();
    out << indent() << "else" << endl;
    indent_up();
    out << indent() << "Console.Error.WriteLine(" << tmpvar << ");" << endl;
    indent_down();

    if (tfunction->is_oneway())
    {
        indent_down();
        out << indent() << "}" << endl;
    }
    else
    {
        tmpvar = tmp("tmp");
        out << indent() << "var " << tmpvar << " = new TApplicationException(TApplicationException.ExceptionType.InternalError,\" Internal error.\");" << endl
            << indent() << "await oprot.WriteMessageBeginAsync(new TMessage(\"" << tfunction->get_name()
            << "\", TMessageType.Exception, seqid), " << CANCELLATION_TOKEN_NAME << ");" << endl
            << indent() << "await " << tmpvar << ".WriteAsync(oprot, " << CANCELLATION_TOKEN_NAME << ");" << endl;
        indent_down();

        out << indent() << "}" << endl
            << indent() << "await oprot.WriteMessageEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl
            << indent() << "await oprot.Transport.FlushAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    }

    indent_down();
    out << indent() << "}" << endl << endl;
}